

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

bool __thiscall cmCTestSVN::NoteOldRevision(cmCTestSVN *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  bVar1 = LoadRepositories(this);
  if (bVar1) {
    p_Var3 = (this->Repositories).
             super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)&this->Repositories) {
      do {
        LoadInfo_abi_cxx11_(local_1a8,this,(SVNInfo *)(p_Var3 + 1));
        std::__cxx11::string::operator=((string *)(p_Var3 + 9),(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        poVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Revision for repository \'",0x19)
        ;
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)p_Var3[1]._M_next,(long)p_Var3[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' before update: ",0x11);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)p_Var3[9]._M_next,(long)p_Var3[9]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"   Old revision of external repository \'",0x28);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)p_Var3[1]._M_next,(long)p_Var3[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' is: ",6);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)p_Var3[9]._M_next,(long)p_Var3[9]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSVN.cxx"
                     ,0x73,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        p_Var3 = p_Var3->_M_next;
      } while (p_Var3 != (_List_node_base *)&this->Repositories);
    }
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).OldRevision);
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev);
  }
  return bVar1;
}

Assistant:

bool cmCTestSVN::NoteOldRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  for (SVNInfo& svninfo : this->Repositories) {
    svninfo.OldRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' before update: " << svninfo.OldRevision << "\n";
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Old revision of external repository '"
                 << svninfo.LocalPath << "' is: " << svninfo.OldRevision
                 << "\n");
  }

  // Set the global old revision to the one of the root
  this->OldRevision = this->RootInfo->OldRevision;
  this->PriorRev.Rev = this->OldRevision;
  return true;
}